

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void opj_j2k_update_tlm(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_part_size)

{
  OPJ_BYTE **ppOVar1;
  OPJ_BYTE *p_buffer;
  
  opj_write_bytes_LE((p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current,
                     p_j2k->m_current_tile_number,1);
  p_buffer = (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current + 1;
  (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = p_buffer;
  opj_write_bytes_LE(p_buffer,p_tile_part_size,4);
  ppOVar1 = &(p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current;
  *ppOVar1 = *ppOVar1 + 4;
  return;
}

Assistant:

static void opj_j2k_update_tlm(opj_j2k_t * p_j2k, OPJ_UINT32 p_tile_part_size)
{
    opj_write_bytes(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current,
                    p_j2k->m_current_tile_number, 1);           /* PSOT */
    ++p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current;

    opj_write_bytes(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current,
                    p_tile_part_size, 4);                                       /* PSOT */
    p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current += 4;
}